

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellBST.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementShellBST::ComputeKRMmatricesGlobal
          (ChElementShellBST *this,ChMatrixRef *H,double Kfactor,double Rfactor,double Mfactor)

{
  long lVar1;
  double *pdVar2;
  double *pdVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  long lVar7;
  long lVar8;
  PointerType pdVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  undefined8 uVar18;
  Index IVar19;
  int iVar20;
  uint uVar21;
  SrcEvaluatorType srcEvaluator;
  undefined8 *puVar22;
  ChStateDelta *in_RCX;
  Index size;
  long lVar23;
  char *pcVar24;
  Index index;
  double *pdVar25;
  ChStateDelta *pCVar26;
  long lVar27;
  ChStateDelta *pCVar28;
  Index dstRows;
  long lVar29;
  ulong uVar30;
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  double dVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  ChMatrixDynamic<> K;
  ChVectorDynamic<> Q1;
  ChVectorDynamic<> Jcolumn;
  ChState state_x_inc;
  ChVectorDynamic<> Q0;
  ChStateDelta state_delta;
  ActualDstType actualDst;
  ChStateDelta state_w;
  ChState state_x;
  SrcEvaluatorType srcEvaluator_1;
  DstEvaluatorType dstEvaluator;
  SrcEvaluatorType srcEvaluator_2;
  DenseStorage<double,__1,__1,__1,_1> local_1c8;
  undefined1 local_1a9 [17];
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_198;
  uint local_17c;
  DenseStorage<double,__1,__1,__1,_1> local_178;
  double local_160;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_158;
  ulong local_140;
  long local_138;
  ChStateDelta *local_130;
  ChStateDelta local_128;
  double local_110;
  double local_108;
  ChMatrixRef *local_100;
  ChStateDelta local_f8;
  ChState local_e0;
  DstXprType local_c8;
  PointerType local_90;
  scalar_constant_op<double> local_88;
  long local_80;
  double *local_78;
  ChStateDelta *local_70;
  ChStateDelta local_68;
  DstEvaluatorType *local_50;
  SrcEvaluatorType *local_48;
  ChStateDelta *local_40;
  DstXprType *local_38;
  
  lVar29 = (H->
           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           ).
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
           .m_rows.m_value;
  local_160 = Mfactor;
  local_110 = Rfactor;
  local_108 = Kfactor;
  iVar20 = (*(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase.
             _vptr_ChElementBase[3])();
  if (lVar29 != iVar20) {
LAB_0079ebc1:
    __assert_fail("(H.rows() == this->GetNdofs() ) && (H.cols() == this->GetNdofs())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementShellBST.cpp"
                  ,0x125,
                  "virtual void chrono::fea::ChElementShellBST::ComputeKRMmatricesGlobal(ChMatrixRef, double, double, double)"
                 );
  }
  lVar29 = (H->
           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           ).
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
           .m_cols.m_value;
  iVar20 = (*(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase.
             _vptr_ChElementBase[3])(this);
  if (lVar29 != iVar20) goto LAB_0079ebc1;
  iVar20 = (*(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase.
             _vptr_ChElementBase[0x1b])(this);
  ChState::ChState(&local_e0,(long)iVar20,(ChIntegrable *)0x0);
  iVar20 = (*(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase.
             _vptr_ChElementBase[0x1c])(this);
  ChStateDelta::ChStateDelta(&local_f8,(long)iVar20,(ChIntegrable *)0x0);
  (*(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase
    [0x1d])(this,0,&local_e0);
  (*(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase
    [0x1e])(this,0,&local_f8);
  uVar21 = (*(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase.
             _vptr_ChElementBase[0x1c])(this);
  iVar20 = (*(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase.
             _vptr_ChElementBase[0x1b])(this);
  local_158.m_storage.m_data = (double *)0x0;
  local_158.m_storage.m_rows = 0;
  pCVar28 = (ChStateDelta *)(long)(int)uVar21;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_158,(Index)pCVar28)
  ;
  ComputeInternalForces_impl(this,(ChVectorDynamic<> *)&local_158,&local_e0,in_RCX,false);
  local_1a9._1_8_ = (void *)0x0;
  local_1a9._9_8_ = (ChStateDelta *)0x0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(local_1a9 + 1),
             (Index)pCVar28);
  local_198.m_storage.m_data = (double *)0x0;
  local_198.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_198,(Index)pCVar28)
  ;
  local_130 = pCVar28;
  local_100 = H;
  if ((local_108 != 0.0) || (NAN(local_108))) {
    local_1c8.m_data = (double *)0x0;
    local_1c8.m_rows = 0;
    local_1c8.m_cols = 0;
    if ((int)uVar21 < 0) goto LAB_0079ebe0;
    if ((uVar21 != 0) &&
       (auVar10._8_8_ = 0, auVar10._0_8_ = pCVar28,
       SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / auVar10,0) < (long)pCVar28)) {
      puVar22 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar22 = std::ostream::_M_insert<bool>;
      __cxa_throw(puVar22,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
              (&local_1c8,(long)pCVar28 * (long)pCVar28,(Index)pCVar28,(Index)pCVar28);
    ChState::ChState((ChState *)&local_178,(long)iVar20,(ChIntegrable *)0x0);
    ChStateDelta::ChStateDelta(&local_128,(Index)pCVar28,(ChIntegrable *)0x0);
    ChStateDelta::setZero(&local_128,(Index)pCVar28,(ChIntegrable *)0x0);
    local_17c = uVar21;
    if (uVar21 != 0) {
      local_140 = 1;
      if (1 < (int)uVar21) {
        local_140 = (ulong)uVar21;
      }
      lVar29 = 0;
      uVar30 = 0;
      do {
        if (local_128.super_ChVectorDynamic<double>.
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <=
            (long)uVar30) goto LAB_0079eaa0;
        local_128.super_ChVectorDynamic<double>.
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar30] =
             local_128.super_ChVectorDynamic<double>.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar30]
             + 1e-10;
        pCVar26 = (ChStateDelta *)&local_e0;
        (*(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase.
          _vptr_ChElementBase[0x1f])(this,0,&local_178,pCVar26,0,&local_128);
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(local_1a9 + 1),
                   (Index)pCVar28);
        if ((long)local_1a9._9_8_ < 0) goto LAB_0079eb7d;
        if ((ChStateDelta *)local_1a9._9_8_ != (ChStateDelta *)0x0) {
          memset((void *)local_1a9._1_8_,0,local_1a9._9_8_ << 3);
        }
        ComputeInternalForces_impl
                  (this,(ChVectorDynamic<> *)(local_1a9 + 1),(ChState *)&local_178,pCVar26,false);
        IVar19 = local_158.m_storage.m_rows;
        pdVar25 = local_158.m_storage.m_data;
        uVar18 = local_1a9._1_8_;
        local_138 = lVar29;
        if (local_128.super_ChVectorDynamic<double>.
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <=
            (long)uVar30) goto LAB_0079eaa0;
        local_128.super_ChVectorDynamic<double>.
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar30] =
             local_128.super_ChVectorDynamic<double>.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar30]
             + -1e-10;
        if (local_1a9._9_8_ != local_158.m_storage.m_rows) goto LAB_0079eb5e;
        if (local_158.m_storage.m_rows < 0) goto LAB_0079eb47;
        if (local_198.m_storage.m_rows != local_158.m_storage.m_rows) {
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    (&local_198,local_158.m_storage.m_rows,1);
        }
        if (local_198.m_storage.m_rows != IVar19) goto LAB_0079eb28;
        pCVar28 = (ChStateDelta *)
                  ((long)&(((ChVectorDynamic<double> *)local_198.m_storage.m_rows)->
                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                          m_data + 7);
        if (-1 < local_198.m_storage.m_rows) {
          pCVar28 = (ChStateDelta *)local_198.m_storage.m_rows;
        }
        pCVar28 = (ChStateDelta *)((ulong)pCVar28 & 0xfffffffffffffff8);
        auVar31 = vbroadcastsd_avx512f(ZEXT816(0xc202a05f20000000));
        if (7 < local_198.m_storage.m_rows) {
          lVar29 = 0;
          do {
            auVar32 = vsubpd_avx512f(*(undefined1 (*) [64])(uVar18 + lVar29 * 8),
                                     *(undefined1 (*) [64])(pdVar25 + lVar29));
            auVar32 = vmulpd_avx512f(auVar32,auVar31);
            *(undefined1 (*) [64])(local_198.m_storage.m_data + lVar29) = auVar32;
            lVar29 = lVar29 + 8;
          } while (lVar29 < (long)pCVar28);
        }
        if ((long)pCVar28 < local_198.m_storage.m_rows) {
          do {
            local_198.m_storage.m_data[(long)pCVar28] =
                 (*(double *)(uVar18 + (long)pCVar28 * 8) - pdVar25[(long)pCVar28]) * -10000000000.0
            ;
            pCVar28 = (ChStateDelta *)
                      ((long)&(pCVar28->super_ChVectorDynamic<double>).
                              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_data + 1);
          } while ((ChStateDelta *)local_198.m_storage.m_rows != pCVar28);
        }
        if (local_1c8.m_rows < 0 && local_1c8.m_data != (double *)0x0) goto LAB_0079eb06;
        if (local_1c8.m_cols <= (long)uVar30) goto LAB_0079eae4;
        if (local_1c8.m_rows != local_198.m_storage.m_rows) goto LAB_0079eac2;
        if (0 < local_1c8.m_rows) {
          pdVar25 = (double *)((long)local_1c8.m_data + local_138);
          pCVar28 = (ChStateDelta *)0x0;
          do {
            *pdVar25 = local_198.m_storage.m_data[(long)pCVar28];
            pCVar28 = (ChStateDelta *)
                      ((long)&(pCVar28->super_ChVectorDynamic<double>).
                              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_data + 1);
            pdVar25 = pdVar25 + local_1c8.m_cols;
          } while ((ChStateDelta *)local_1c8.m_rows != pCVar28);
        }
        uVar30 = uVar30 + 1;
        lVar29 = local_138 + 8;
        pCVar28 = local_130;
        H = local_100;
      } while (uVar30 != local_140);
    }
    uVar21 = local_17c;
    if (-1 < (local_1c8.m_cols | local_1c8.m_rows)) {
      local_c8.
      super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
      .
      super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_1>
      .
      super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_0>
      .m_data = (H->
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                ).
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                .
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                .m_data;
      local_c8.
      super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
      .m_outerStride =
           (H->
           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           ).m_stride.m_outer.m_value;
      local_c8.
      super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
      .m_startRow.m_value = 0;
      local_c8.
      super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
      .m_startCol.m_value = 0;
      local_c8.
      super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
      .
      super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_1>
      .
      super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_0>
      .m_cols.m_value = (long)pCVar28;
      local_c8.
      super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
      .m_xpr = H;
      if (((H->
           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           ).
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
           .m_rows.m_value < (long)pCVar28) ||
         ((H->
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          ).
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_cols.m_value < (long)pCVar28)) goto LAB_0079eb9f;
      local_88.m_other = local_108;
      local_78 = local_1c8.m_data;
      local_70 = (ChStateDelta *)local_1c8.m_cols;
      local_c8.
      super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
      .
      super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_1>
      .
      super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_0>
      .m_rows.m_value = (long)pCVar28;
      if (((ChStateDelta *)local_1c8.m_rows != pCVar28) ||
         ((ChStateDelta *)local_1c8.m_cols != pCVar28)) {
        pcVar24 = 
        "void Eigen::DenseBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>>]"
        ;
        goto LAB_0079ead7;
      }
      local_50 = (DstEvaluatorType *)&local_68;
      local_48 = (SrcEvaluatorType *)&local_90;
      local_40 = (ChStateDelta *)local_1a9;
      local_38 = &local_c8;
      local_68.super_ChVectorDynamic<double>.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           local_c8.
           super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
           .
           super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
           .
           super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_1>
           .
           super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_0>
           .m_data;
      local_68.integrable =
           (ChIntegrable *)
           local_c8.
           super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
           .
           super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
           .m_outerStride;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>,_const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
      ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
             *)&local_50);
      if (local_128.super_ChVectorDynamic<double>.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
          (double *)0x0) {
        free((void *)local_128.super_ChVectorDynamic<double>.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                     [-1]);
      }
      if (local_178.m_data != (double *)0x0) {
        free((void *)local_178.m_data[-1]);
      }
      if (local_1c8.m_data != (double *)0x0) {
        free((void *)local_1c8.m_data[-1]);
      }
      goto LAB_0079e500;
    }
  }
  else {
    if (((H->
         super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
         ).
         super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
         .
         super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
         .m_cols.m_value |
        (H->
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        ).
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_rows.m_value) < 0) {
      pcVar24 = 
      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1, 1>]"
      ;
      goto LAB_0079eb92;
    }
    local_c8.
    super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
    .
    super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_1>
    .
    super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_0>
    .m_rows.m_value = (long)&local_50;
    local_50 = (DstEvaluatorType *)0x0;
    local_90 = (H->
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
               ).
               super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
               .
               super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
               .m_data;
    local_c8.
    super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
    .
    super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_1>
    .
    super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_0>
    .m_data = (PointerType)&local_90;
    local_80 = (H->
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
               ).m_stride.m_outer.m_value;
    local_c8.
    super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
    .
    super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_1>
    .
    super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_0>
    .m_cols.m_value = (long)&local_68;
    local_c8.
    super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
    .m_xpr = H;
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
           *)&local_c8);
LAB_0079e500:
    if ((local_110 == 0.0) && (!NAN(local_110))) {
LAB_0079e91e:
      if ((local_160 != 0.0) || (NAN(local_160))) {
        dVar33 = local_160;
        (*(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase.
          _vptr_ChElementBase[0x28])(this);
        dVar33 = dVar33 * this->tot_thickness * this->area * 0.3333333333333333;
        lVar29 = (H->
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                 ).
                 super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                 .
                 super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                 .m_rows.m_value;
        lVar23 = 0;
        lVar27 = 0;
        do {
          if ((lVar29 <= lVar27) ||
             (lVar7 = (H->
                      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                      ).
                      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                      .
                      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                      .m_cols.m_value, lVar7 <= lVar27)) {
LAB_0079ea81:
            __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 1>::operator()(Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, Level = 1]"
                         );
          }
          lVar8 = (H->
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  ).m_stride.m_outer.m_value;
          pdVar9 = (H->
                   super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                   ).
                   super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                   .
                   super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                   .m_data;
          auVar36._8_8_ = 0;
          auVar36._0_8_ = *(ulong *)((long)pdVar9 + lVar8 * lVar27 * 8 + lVar23);
          auVar4._8_8_ = 0;
          auVar4._0_8_ = local_160;
          auVar34._8_8_ = 0;
          auVar34._0_8_ = dVar33;
          auVar10 = vfmadd231sd_fma(auVar36,auVar34,auVar4);
          *(long *)((long)pdVar9 + lVar8 * lVar27 * 8 + lVar23) = auVar10._0_8_;
          lVar1 = lVar27 + 1;
          if ((lVar29 <= lVar1) || (lVar7 <= lVar1)) goto LAB_0079ea81;
          auVar37._8_8_ = 0;
          auVar37._0_8_ = *(ulong *)((long)pdVar9 + lVar1 * lVar8 * 8 + lVar23 + 8);
          auVar5._8_8_ = 0;
          auVar5._0_8_ = local_160;
          auVar10 = vfmadd231sd_fma(auVar37,auVar34,auVar5);
          *(long *)((long)pdVar9 + lVar1 * lVar8 * 8 + lVar23 + 8) = auVar10._0_8_;
          lVar1 = lVar27 + 2;
          if ((lVar29 <= lVar1) || (lVar7 <= lVar1)) goto LAB_0079ea81;
          auVar38._8_8_ = 0;
          auVar38._0_8_ = *(ulong *)((long)pdVar9 + lVar8 * lVar1 * 8 + lVar23 + 0x10);
          auVar6._8_8_ = 0;
          auVar6._0_8_ = local_160;
          auVar35._8_8_ = 0;
          auVar35._0_8_ = dVar33;
          auVar10 = vfmadd231sd_fma(auVar38,auVar35,auVar6);
          *(long *)((long)pdVar9 + lVar8 * lVar1 * 8 + lVar23 + 0x10) = auVar10._0_8_;
          lVar27 = lVar27 + 3;
          lVar23 = lVar23 + 0x18;
        } while (lVar27 != 9);
      }
      if (local_198.m_storage.m_data != (double *)0x0) {
        free((void *)local_198.m_storage.m_data[-1]);
      }
      if ((void *)local_1a9._1_8_ != (void *)0x0) {
        free(*(void **)(local_1a9._1_8_ + -8));
      }
      if (local_158.m_storage.m_data != (double *)0x0) {
        free((void *)local_158.m_storage.m_data[-1]);
      }
      if (local_f8.super_ChVectorDynamic<double>.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
          (double *)0x0) {
        free((void *)local_f8.super_ChVectorDynamic<double>.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                     [-1]);
      }
      if (local_e0.super_ChVectorDynamic<double>.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
          (double *)0x0) {
        free((void *)local_e0.super_ChVectorDynamic<double>.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                     [-1]);
      }
      return;
    }
    ChStateDelta::ChStateDelta((ChStateDelta *)&local_1c8,(Index)pCVar28,(ChIntegrable *)0x0);
    pdVar25 = local_f8.super_ChVectorDynamic<double>.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    if (local_1c8.m_rows !=
        local_f8.super_ChVectorDynamic<double>.
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_1c8,
                 local_f8.super_ChVectorDynamic<double>.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,1);
    }
    pCVar28 = local_130;
    if (local_1c8.m_rows !=
        local_f8.super_ChVectorDynamic<double>.
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
      pcVar24 = 
      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
      ;
LAB_0079eb3d:
      __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,pcVar24);
    }
    pCVar26 = (ChStateDelta *)
              ((long)&(((ChVectorDynamic<double> *)local_1c8.m_rows)->
                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                      m_data + 7);
    if (-1 < local_1c8.m_rows) {
      pCVar26 = (ChStateDelta *)local_1c8.m_rows;
    }
    pCVar26 = (ChStateDelta *)((ulong)pCVar26 & 0xfffffffffffffff8);
    if (7 < local_1c8.m_rows) {
      lVar29 = 0;
      do {
        pdVar2 = pdVar25 + lVar29;
        dVar33 = pdVar2[1];
        dVar12 = pdVar2[2];
        dVar13 = pdVar2[3];
        dVar14 = pdVar2[4];
        dVar15 = pdVar2[5];
        dVar16 = pdVar2[6];
        dVar17 = pdVar2[7];
        pdVar3 = local_1c8.m_data + lVar29;
        *pdVar3 = *pdVar2;
        pdVar3[1] = dVar33;
        pdVar3[2] = dVar12;
        pdVar3[3] = dVar13;
        pdVar3[4] = dVar14;
        pdVar3[5] = dVar15;
        pdVar3[6] = dVar16;
        pdVar3[7] = dVar17;
        lVar29 = lVar29 + 8;
      } while (lVar29 < (long)pCVar26);
    }
    if ((long)pCVar26 < local_1c8.m_rows) {
      do {
        local_1c8.m_data[(long)pCVar26] = pdVar25[(long)pCVar26];
        pCVar26 = (ChStateDelta *)
                  ((long)&(pCVar26->super_ChVectorDynamic<double>).
                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                          m_data + 1);
      } while ((ChStateDelta *)local_1c8.m_rows != pCVar26);
    }
    local_1c8.m_cols = (Index)local_f8.integrable;
    local_178.m_data = (double *)0x0;
    local_178.m_rows = 0;
    local_178.m_cols = 0;
    if ((int)uVar21 < 0) {
LAB_0079ebe0:
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>]"
                   );
    }
    if ((uVar21 != 0) &&
       (auVar11._8_8_ = 0, auVar11._0_8_ = local_130,
       SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / auVar11,0) < (long)local_130)) {
      puVar22 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar22 = std::ostream::_M_insert<bool>;
      __cxa_throw(puVar22,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    pCVar26 = local_130;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
              (&local_178,(long)local_130 * (long)local_130,(Index)local_130,(Index)local_130);
    if (uVar21 != 0) {
      local_140 = 1;
      if (1 < (int)uVar21) {
        local_140 = (ulong)uVar21;
      }
      lVar29 = 0;
      uVar30 = 0;
      do {
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(local_1a9 + 1),
                   (Index)pCVar28);
        if ((long)local_1a9._9_8_ < 0) goto LAB_0079eb7d;
        if ((ChStateDelta *)local_1a9._9_8_ != (ChStateDelta *)0x0) {
          memset((void *)local_1a9._1_8_,0,local_1a9._9_8_ << 3);
        }
        if (local_1c8.m_rows <= (long)uVar30) {
LAB_0079eaa0:
          __assert_fail("index >= 0 && index < size()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                       );
        }
        local_1c8.m_data[uVar30] = local_1c8.m_data[uVar30] + 1e-10;
        ComputeInternalForces_impl
                  (this,(ChVectorDynamic<> *)(local_1a9 + 1),&local_e0,pCVar26,false);
        IVar19 = local_158.m_storage.m_rows;
        pdVar25 = local_158.m_storage.m_data;
        uVar18 = local_1a9._1_8_;
        local_138 = lVar29;
        if (local_1c8.m_rows <= (long)uVar30) goto LAB_0079eaa0;
        local_1c8.m_data[uVar30] = local_1c8.m_data[uVar30] + -1e-10;
        if (local_1a9._9_8_ != local_158.m_storage.m_rows) {
LAB_0079eb5e:
          __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                        "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                        "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
                       );
        }
        if (local_158.m_storage.m_rows < 0) goto LAB_0079eb47;
        if (local_198.m_storage.m_rows != local_158.m_storage.m_rows) {
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    (&local_198,local_158.m_storage.m_rows,1);
        }
        if (local_198.m_storage.m_rows != IVar19) goto LAB_0079eb28;
        pCVar28 = (ChStateDelta *)
                  ((long)&(((ChVectorDynamic<double> *)local_198.m_storage.m_rows)->
                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                          m_data + 7);
        if (-1 < local_198.m_storage.m_rows) {
          pCVar28 = (ChStateDelta *)local_198.m_storage.m_rows;
        }
        pCVar28 = (ChStateDelta *)((ulong)pCVar28 & 0xfffffffffffffff8);
        auVar31 = vbroadcastsd_avx512f(ZEXT816(0xc202a05f20000000));
        if (7 < local_198.m_storage.m_rows) {
          lVar29 = 0;
          do {
            auVar32 = vsubpd_avx512f(*(undefined1 (*) [64])(uVar18 + lVar29 * 8),
                                     *(undefined1 (*) [64])(pdVar25 + lVar29));
            auVar32 = vmulpd_avx512f(auVar32,auVar31);
            *(undefined1 (*) [64])(local_198.m_storage.m_data + lVar29) = auVar32;
            lVar29 = lVar29 + 8;
          } while (lVar29 < (long)pCVar28);
        }
        if ((long)pCVar28 < local_198.m_storage.m_rows) {
          do {
            local_198.m_storage.m_data[(long)pCVar28] =
                 (*(double *)(uVar18 + (long)pCVar28 * 8) - pdVar25[(long)pCVar28]) * -10000000000.0
            ;
            pCVar28 = (ChStateDelta *)
                      ((long)&(pCVar28->super_ChVectorDynamic<double>).
                              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_data + 1);
          } while ((ChStateDelta *)local_198.m_storage.m_rows != pCVar28);
        }
        if (local_178.m_rows < 0 && local_178.m_data != (double *)0x0) {
LAB_0079eb06:
          __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                        ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                        "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>, Level = 0]"
                       );
        }
        if (local_178.m_cols <= (long)uVar30) {
LAB_0079eae4:
          __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                        ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x7a,
                        "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                       );
        }
        if (local_178.m_rows != local_198.m_storage.m_rows) goto LAB_0079eac2;
        pCVar26 = (ChStateDelta *)local_198.m_storage.m_rows;
        if (0 < local_178.m_rows) {
          pdVar25 = (double *)((long)local_178.m_data + local_138);
          pCVar26 = (ChStateDelta *)0x0;
          do {
            *pdVar25 = local_198.m_storage.m_data[(long)pCVar26];
            pCVar26 = (ChStateDelta *)
                      ((long)&(pCVar26->super_ChVectorDynamic<double>).
                              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_data + 1);
            pdVar25 = pdVar25 + local_178.m_cols;
          } while ((ChStateDelta *)local_178.m_rows != pCVar26);
        }
        uVar30 = uVar30 + 1;
        lVar29 = local_138 + 8;
        pCVar28 = local_130;
        H = local_100;
      } while (uVar30 != local_140);
    }
    if (-1 < (local_178.m_cols | local_178.m_rows)) {
      local_c8.
      super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
      .
      super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_1>
      .
      super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_0>
      .m_data = (H->
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                ).
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                .
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                .m_data;
      local_c8.
      super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
      .m_outerStride =
           (H->
           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           ).m_stride.m_outer.m_value;
      local_c8.
      super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
      .m_startRow.m_value = 0;
      local_c8.
      super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
      .m_startCol.m_value = 0;
      local_c8.
      super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
      .
      super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_1>
      .
      super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_0>
      .m_cols.m_value = (long)pCVar28;
      local_c8.
      super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
      .m_xpr = H;
      if (((H->
           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           ).
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
           .m_rows.m_value < (long)pCVar28) ||
         ((H->
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          ).
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_cols.m_value < (long)pCVar28)) {
LAB_0079eb9f:
        local_c8.
        super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
        .m_startCol.m_value = 0;
        local_c8.
        super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
        .m_startRow.m_value = 0;
        local_c8.
        super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
        .
        super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_1>
        .
        super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_0>
        .m_rows.m_value =
             local_c8.
             super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
             .
             super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_1>
             .
             super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_0>
             .m_cols.m_value;
        __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                      "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
                     );
      }
      local_88.m_other = local_110;
      local_78 = local_178.m_data;
      local_70 = (ChStateDelta *)local_178.m_cols;
      local_c8.
      super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
      .
      super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_1>
      .
      super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_0>
      .m_rows.m_value = (long)pCVar28;
      if (((ChStateDelta *)local_178.m_rows != pCVar28) ||
         ((ChStateDelta *)local_178.m_cols != pCVar28)) {
        __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>, const Eigen::Matrix<double, -1, -1, 1>>, Functor = Eigen::internal::add_assign_op<double, double>]"
                     );
      }
      local_50 = (DstEvaluatorType *)&local_68;
      local_48 = (SrcEvaluatorType *)&local_90;
      local_40 = &local_128;
      local_38 = &local_c8;
      local_68.super_ChVectorDynamic<double>.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           local_c8.
           super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
           .
           super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
           .
           super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_1>
           .
           super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_0>
           .m_data;
      local_68.integrable =
           (ChIntegrable *)
           local_c8.
           super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
           .
           super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
           .m_outerStride;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>,_const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>_>,_Eigen::internal::add_assign_op<double,_double>,_0>,_4,_0>
      ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::internal::add_assign_op<double,_double>,_0>
             *)&local_50);
      if (local_178.m_data != (double *)0x0) {
        free((void *)local_178.m_data[-1]);
      }
      if (local_1c8.m_data != (double *)0x0) {
        free((void *)local_1c8.m_data[-1]);
      }
      goto LAB_0079e91e;
    }
  }
  pcVar24 = 
  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, -1, 1>]"
  ;
  goto LAB_0079eb92;
LAB_0079eb7d:
  pcVar24 = 
  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
  ;
  goto LAB_0079eb92;
LAB_0079eb28:
  pcVar24 = 
  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>>, T1 = double, T2 = double]"
  ;
  goto LAB_0079eb3d;
LAB_0079eac2:
  pcVar24 = 
  "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>]"
  ;
LAB_0079ead7:
  __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,pcVar24);
LAB_0079eb47:
  pcVar24 = 
  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1>]"
  ;
LAB_0079eb92:
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,pcVar24);
}

Assistant:

void ChElementShellBST::ComputeKRMmatricesGlobal(ChMatrixRef H, double Kfactor, double Rfactor, double Mfactor) {

	assert((H.rows() == this->GetNdofs() ) && (H.cols() == this->GetNdofs()));

	// BRUTE FORCE METHOD: USE NUMERICAL DIFFERENTIATION!

	//
	// The K stiffness matrix of this element:  
	//

	ChState      state_x(this->LoadableGet_ndof_x(), nullptr);
	ChStateDelta state_w(this->LoadableGet_ndof_w(), nullptr);
	this->LoadableGetStateBlock_x(0, state_x);
	this->LoadableGetStateBlock_w(0, state_w);

	double Delta = 1e-10;

	int mrows_w = this->LoadableGet_ndof_w();
	int mrows_x = this->LoadableGet_ndof_x();

	
	// compute Q at current speed & position, x_0, v_0
	ChVectorDynamic<> Q0(mrows_w);
	this->ComputeInternalForces_impl(Q0, state_x, state_w, true);     // Q0 = Q(x, v)

	ChVectorDynamic<> Q1(mrows_w);
	ChVectorDynamic<> Jcolumn(mrows_w);
	

	if (Kfactor) {
		ChMatrixDynamic<> K(mrows_w, mrows_w);

		ChState       state_x_inc(mrows_x, nullptr);
		ChStateDelta  state_delta(mrows_w, nullptr);

		// Compute K=-dQ(x,v)/dx by backward differentiation
		state_delta.setZero(mrows_w, nullptr);

		for (int i = 0; i < mrows_w; ++i) {
			state_delta(i) += Delta;
			this->LoadableStateIncrement(0, state_x_inc, state_x, 0, state_delta);  // exponential, usually state_x_inc(i) = state_x(i) + Delta;

			Q1.setZero(mrows_w);
			this->ComputeInternalForces_impl(Q1, state_x_inc, state_w, true);   // Q1 = Q(x+Dx, v)
			state_delta(i) -= Delta;

			Jcolumn = (Q1 - Q0) * (-1.0 / Delta);   // - sign because K=-dQ/dx
			K.col(i) = Jcolumn;
		}

		// finally, store K into H:
		H.block(0, 0, mrows_w, mrows_w) = Kfactor * K;
	}
	else
		H.setZero();


	//
	// The R damping matrix of this element: 
	//

	if (Rfactor) {
		// Compute R=-dQ(x,v)/dv by backward differentiation
		//if (this->section->GetDamping()) {
		ChStateDelta  state_w_inc(mrows_w, nullptr);
		state_w_inc = state_w;
		ChMatrixDynamic<> R(mrows_w, mrows_w);

		for (int i = 0; i < mrows_w; ++i) {
			Q1.setZero(mrows_w);

			state_w_inc(i) += Delta;
			this->ComputeInternalForces_impl(Q1, state_x, state_w_inc, true); // Q1 = Q(x, v+Dv)
			state_w_inc(i) -= Delta;

			Jcolumn = (Q1 - Q0) * (-1.0 / Delta);   // - sign because R=-dQ/dv
			R.col(i) = Jcolumn;
		}

		H.block(0, 0, mrows_w, mrows_w) += Rfactor * R;
	}

	//
	// The M mass matrix of this element: (lumped version)
	//

	if (Mfactor) {
		// loop over all layers, to compute total "mass per area" = sum(rho_i*thickness_i) = average_rho * sum(thickness_i)
		double avg_density = this->GetDensity();
		double mass_per_area = avg_density * tot_thickness;

		// Heuristic, simplified 'lumped' mass matrix to central three nodes.
		// This is simpler than the stiffness-consistent mass matrix that would require
		// integration over gauss points.

		double nodemass = (1.0 / 3.0) * (this->area * mass_per_area);

		for (int n = 0; n < 3; n++) {

			int node_off = n * 3;
			H(node_off + 0, node_off + 0) += Mfactor * nodemass;
			H(node_off + 1, node_off + 1) += Mfactor * nodemass;
			H(node_off + 2, node_off + 2) += Mfactor * nodemass;

		}
	}
}